

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.cc
# Opt level: O0

double lf::fe::IJacobi(uint n,double alpha,double x)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double cnL;
  double bnL;
  double anL;
  double Pjp1;
  double dStack_60;
  uint j;
  double Pj;
  double Pjm1;
  double Pjm2;
  double djp1P;
  double cjp1P;
  double bjp1P;
  double ajp1P;
  double x_local;
  double alpha_local;
  double dStack_10;
  uint n_local;
  
  if (n == 0) {
    dStack_10 = -1.0;
  }
  else {
    dStack_10 = x;
    if (n != 1) {
      Pjm1 = 1.0;
      Pj = (alpha + 2.0) * x + -1.0;
      dStack_60 = (((alpha + 4.0) - 1.0) *
                   ((alpha + 4.0) * ((alpha + 4.0) - 2.0) * (x + x + -1.0) + alpha * alpha) * Pj +
                  -(((alpha + 2.0) - 1.0) * 2.0 * 1.0 * (alpha + 4.0) * 1.0)) /
                  ((alpha + 2.0) * 4.0 * ((alpha + 4.0) - 2.0));
      for (Pjp1._4_4_ = 2; Pjp1._4_4_ < n; Pjp1._4_4_ = Pjp1._4_4_ + 1) {
        uVar2 = Pjp1._4_4_ + 1;
        dVar5 = (double)(Pjp1._4_4_ * 2 + 2);
        iVar1 = Pjp1._4_4_ * 2;
        dVar3 = (double)(Pjp1._4_4_ * 2 + 2) + alpha;
        dVar4 = ((double)(Pjp1._4_4_ + 1) + alpha) - 1.0;
        dVar4 = (dVar4 + dVar4) * (double)Pjp1._4_4_ * ((double)(Pjp1._4_4_ * 2 + 2) + alpha) * Pj;
        Pjm1 = Pj;
        Pj = dStack_60;
        dStack_60 = ((((double)(iVar1 + 2) + alpha) - 1.0) *
                     (dVar3 * (dVar3 - 2.0) * (x + x + -1.0) + alpha * alpha) * dStack_60 + -dVar4)
                    / (dVar5 * ((double)uVar2 + alpha) * ((dVar5 + alpha) - 2.0));
      }
      dVar3 = (double)(n * 2) + alpha;
      dVar4 = (double)(n * 2) + alpha;
      dStack_10 = -((double)(n - 1) /
                   ((((double)(n * 2) + alpha) - 2.0) * (((double)(n * 2) + alpha) - 1.0))) * Pjm1 +
                  (((double)n + alpha) / ((dVar3 + -1.0) * dVar3)) * dStack_60 +
                  (alpha / ((dVar4 - 2.0) * dVar4)) * Pj;
    }
  }
  return dStack_10;
}

Assistant:

double IJacobi(unsigned n, double alpha, double x) {
  if (n == 0) {
    return -1;
  }
  if (n == 1) {
    return x;
  }
  // Compute the n-th, (n-1)-th and (n-2)-th Jacobi Polynomial
  // This uses the same recurrence relation as the `eval` method
  double ajp1P = 2 * 2 * (2 + alpha) * (2 * 2 + alpha - 2);
  double bjp1P = 2 * 2 + alpha - 1;
  double cjp1P = (2 * 2 + alpha) * (2 * 2 + alpha - 2);
  double djp1P = 2 * (2 + alpha - 1) * (2 - 1) * (2 * 2 + alpha);
  double Pjm2 = 1;
  double Pjm1 = (2 + alpha) * x - 1;
  double Pj =
      (bjp1P * (cjp1P * (2 * x - 1) + alpha * alpha) * Pjm1 - djp1P * Pjm2) /
      ajp1P;
  for (unsigned j = 2; j < n; ++j) {
    ajp1P = 2 * (j + 1) * ((j + 1) + alpha) * (2 * (j + 1) + alpha - 2);
    bjp1P = 2 * (j + 1) + alpha - 1;
    cjp1P = (2 * (j + 1) + alpha) * (2 * (j + 1) + alpha - 2);
    djp1P = 2 * ((j + 1) + alpha - 1) * ((j + 1) - 1) * (2 * (j + 1) + alpha);
    const double Pjp1 =
        (bjp1P * (cjp1P * (2 * x - 1) + alpha * alpha) * Pj - djp1P * Pjm1) /
        ajp1P;
    Pjm2 = Pjm1;
    Pjm1 = Pj;
    Pj = Pjp1;
  }
  // Compute the integral by the formula in the docstring
  const double anL = (n + alpha) / ((2 * n + alpha - 1) * (2 * n + alpha));
  const double bnL = alpha / ((2 * n + alpha - 2) * (2 * n + alpha));
  const double cnL = (n - 1) / ((2 * n + alpha - 2) * (2 * n + alpha - 1));
  return anL * Pj + bnL * Pjm1 - cnL * Pjm2;
}